

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

int dotClassIndex(int t,float mingap)

{
  uint local_14;
  int idx;
  float mingap_local;
  int t_local;
  
  if (t == 0) {
    local_14 = (uint)(mingap <= HighGoodCut);
  }
  else if (t < 0) {
    if (mingap <= LowGoodCut) {
      if (LworseOverlap == 0) {
        local_14 = 4;
      }
      else if (mingap <= WorseBumpCut) {
        local_14 = 5;
      }
      else {
        local_14 = 4;
      }
    }
    else {
      local_14 = 3;
    }
  }
  else if (LweakHbonds == 0) {
    local_14 = 6;
  }
  else if (mingap <= 0.0) {
    local_14 = 6;
  }
  else {
    local_14 = 2;
  }
  return local_14;
}

Assistant:

int dotClassIndex(int t, float mingap)
{
   int idx = 0;
    
   // Old code for old definition
   //if      (t == 0) { idx = (mingap > HighGoodCut) ? 0 : 1; } /* contact */
   //else if (t  < 0) { idx = (mingap >  LowGoodCut) ? 2 : 3; } /* clash   */
   //else if (LweakHbonds)
   //{
   //        if (t==1) {idx = 4;                     } /*good hbond*/
   //        else      {idx = 5;                     } /*weak hbond 20111215dcr*/
   //}
   //else             { idx = 4;                              } /* hbonds  */
   
   /* new code SJ 04/10/2105 to implement the new definiion above*/
    if (t == 0) { /* contact */
        if (mingap > HighGoodCut)
            idx = 0; /* wide contact*/
        else
            idx = 1; /* close contact*/
    }
    else if(t < 0){ /* clash*/
        if (mingap > LowGoodCut)
            idx = 3; /* small overlap*/
        else if(LworseOverlap) /* divide bad and worse overlap only if this is true*/
        {
            if(mingap > WorseBumpCut)
                idx = 4; /* bad overlap */
            else
                idx = 5; /* worse overlap */
        }
        else
            idx = 4; /* bad overlap*/
    }
    else{ /* H bond */
        if(LweakHbonds){/* divide H bonds into weak only if this is true.*/
            if(mingap > 0)
                idx = 2; /* weak H bond*/
            else
                idx = 6; /* H bonds*/
        }
        else
            idx = 6; /* H bonds*/
    }
    return idx;
}